

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolInfo.cpp
# Opt level: O0

void __thiscall MethodInfo::Print(MethodInfo *this,ofstream *out)

{
  bool bVar1;
  ostream *poVar2;
  element_type *this_00;
  element_type *peVar3;
  ofstream *out_local;
  MethodInfo *this_local;
  
  poVar2 = std::operator<<((ostream *)out,"\t");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"name: ");
  poVar2 = std::operator<<(poVar2,(string *)this);
  poVar2 = std::operator<<(poVar2," ");
  std::operator<<(poVar2,"\n");
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->returnType);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)out,"\t");
    poVar2 = std::operator<<(poVar2,"\t");
    std::operator<<(poVar2,"returnType: ");
    this_00 = std::__shared_ptr_access<TypeInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<TypeInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &this->returnType);
    TypeInfo::Print(this_00,out);
    std::operator<<((ostream *)out,"\n");
  }
  poVar2 = std::operator<<((ostream *)out,"\t");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"isPublic: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(this->isPublic & 1));
  poVar2 = std::operator<<(poVar2," ");
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)out,"\t");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"arguments: {");
  std::operator<<(poVar2,"\n");
  peVar3 = std::__shared_ptr_access<VariablesInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VariablesInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->arguments);
  VariablesInfo::Print(peVar3,out);
  poVar2 = std::operator<<((ostream *)out,"\t");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"} ");
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)out,"\t");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"fields: {");
  std::operator<<(poVar2,"\n");
  peVar3 = std::__shared_ptr_access<VariablesInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VariablesInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->fields);
  VariablesInfo::Print(peVar3,out);
  poVar2 = std::operator<<((ostream *)out,"\t");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"} ");
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

void MethodInfo::Print( std::ofstream& out )
{
	out << "\t" << "\t" << "name: " << name << " " << "\n";
	if( returnType ) {
		out << "\t" << "\t" << "returnType: ";
		returnType->Print( out ); 
		out << "\n";
	}
	out << "\t" << "\t" << "isPublic: " << isPublic << " " << "\n";
	out << "\t" << "\t" << "arguments: {" << "\n";
	arguments->Print( out );
	out << "\t" << "\t" << "} " << "\n";
	out << "\t" << "\t" << "fields: {" << "\n";
	fields->Print( out );
	out << "\t" << "\t" << "} " << "\n";
}